

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O2

int query_cubemap_capability(void)

{
  char *pcVar1;
  
  if (has_cubemap_capability != -1) {
    return has_cubemap_capability;
  }
  pcVar1 = (char *)glGetString(0x1f03);
  pcVar1 = strstr(pcVar1,"GL_ARB_texture_cube_map");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = (char *)glGetString(0x1f03);
    pcVar1 = strstr(pcVar1,"GL_EXT_texture_cube_map");
    if (pcVar1 == (char *)0x0) {
      has_cubemap_capability = 0;
      return 0;
    }
  }
  has_cubemap_capability = 1;
  return 1;
}

Assistant:

int query_cubemap_capability( void )
{
	/*	check for the capability	*/
	if( has_cubemap_capability == SOIL_CAPABILITY_UNKNOWN )
	{
		/*	we haven't yet checked for the capability, do so	*/
		if(
			(NULL == strstr( (char const*)glGetString( GL_EXTENSIONS ),
				"GL_ARB_texture_cube_map" ) )
		&&
			(NULL == strstr( (char const*)glGetString( GL_EXTENSIONS ),
				"GL_EXT_texture_cube_map" ) )
			)
		{
			/*	not there, flag the failure	*/
			has_cubemap_capability = SOIL_CAPABILITY_NONE;
		} else
		{
			/*	it's there!	*/
			has_cubemap_capability = SOIL_CAPABILITY_PRESENT;
		}
	}
	/*	let the user know if we can do cubemaps or not	*/
	return has_cubemap_capability;
}